

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O2

void cuddCacheInsert(DdManager *table,ptruint op,DdNode *f,DdNode *g,DdNode *h,DdNode *data)

{
  DdCache *pDVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  
  uVar4 = (uint)op & 0xe;
  uVar2 = ((((uint)h & 1) + *(int *)(((ulong)h & 0xfffffffffffffffe) + 0x20) * 2 +
           (uVar4 | ((uint)f & 1) + *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2)) *
           0xc00005 +
          ((uint)(op >> 4) | ((uint)g & 1) + *(int *)(((ulong)g & 0xfffffffffffffffe) + 0x20) * 2))
          * 0x40f1f9;
  uVar3 = uVar2 >> ((byte)table->cacheShift & 0x1f);
  pDVar1 = table->cache;
  if (pDVar1[(int)uVar3].data == (DdNode *)0x0) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 1.0;
  }
  table->cachecollisions = dVar5 + table->cachecollisions;
  table->cacheinserts = table->cacheinserts + 1.0;
  pDVar1[(int)uVar3].f = (DdNode *)((ulong)uVar4 | (ulong)f);
  pDVar1[(int)uVar3].g = (DdNode *)(op >> 4 | (ulong)g);
  pDVar1[(int)uVar3].h = (ptruint)h;
  pDVar1[(int)uVar3].data = data;
  pDVar1[(int)uVar3].hash = uVar2;
  return;
}

Assistant:

void
cuddCacheInsert(
  DdManager * table,
  ptruint op,
  DdNode * f,
  DdNode * g,
  DdNode * h,
  DdNode * data)
{
    int posn;
    unsigned hash;
    register DdCache *entry;
    ptruint uf, ug, uh;
    ptruint ufc, ugc, uhc;

    uf = (ptruint) f | (op & 0xe);
    ug = (ptruint) g | (op >> 4);
    uh = (ptruint) h;

    ufc = (ptruint) cuddF2L(f) | (op & 0xe);
    ugc = (ptruint) cuddF2L(g) | (op >> 4);
    uhc = (ptruint) cuddF2L(h);

    hash = ddCHash2_(uhc,ufc,ugc);
//    posn = ddCHash2(uhc,ufc,ugc,table->cacheShift);
    posn = hash >> table->cacheShift;
    entry = &table->cache[posn];

    table->cachecollisions += entry->data != NULL;
    table->cacheinserts++;

    entry->f    = (DdNode *) uf;
    entry->g    = (DdNode *) ug;
    entry->h    = uh;
    entry->data = data;
#ifdef DD_CACHE_PROFILE
    entry->count++;
#endif
    entry->hash = hash;

}